

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void __thiscall Kernel::InferenceStore::ProofPrinter::print(ProofPrinter *this)

{
  bool bVar1;
  long in_RDI;
  ProofPrinter *unaff_retaddr;
  Unit *cs;
  Unit *in_stack_00000028;
  ProofPrinter *in_stack_00000030;
  
  while( true ) {
    bVar1 = Lib::Stack<Kernel::Unit_*>::isNonEmpty((Stack<Kernel::Unit_*> *)(in_RDI + 8));
    if (!bVar1) break;
    Lib::Stack<Kernel::Unit_*>::pop((Stack<Kernel::Unit_*> *)(in_RDI + 8));
    handleStep(in_stack_00000030,in_stack_00000028);
  }
  if ((*(byte *)(in_RDI + 0x81) & 1) != 0) {
    printDelayed(unaff_retaddr);
  }
  return;
}

Assistant:

virtual void print()
  {
    while(outKernel.isNonEmpty()) {
      Unit* cs=outKernel.pop();
      handleStep(cs);
    }
    if(delayPrinting) printDelayed();
  }